

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred_sse.c
# Opt level: O3

void uavs3d_ipred_ang_xy_16_sse(pel *src,pel *dst,int i_dst,int mode,int width,int height)

{
  undefined8 *puVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  ulong uVar4;
  pel *ppVar5;
  undefined1 (*pauVar6) [16];
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  pel *ppVar13;
  long lVar14;
  undefined1 in_XMM0 [16];
  undefined1 auVar15 [16];
  undefined1 in_XMM1 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar16 [16];
  ushort uVar17;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  undefined1 in_XMM4 [16];
  undefined1 auVar18 [16];
  ushort uVar26;
  undefined1 auVar19 [16];
  undefined1 auVar27 [16];
  ushort uVar28;
  short sVar29;
  ushort uVar30;
  short sVar31;
  ushort uVar32;
  short sVar33;
  ushort uVar34;
  short sVar35;
  ushort uVar36;
  short sVar37;
  ushort uVar38;
  short sVar39;
  ushort uVar40;
  short sVar41;
  ushort uVar42;
  short sVar43;
  undefined1 in_XMM7 [16];
  undefined1 auVar44 [16];
  undefined1 in_XMM8 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar45 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar46 [16];
  pel first_line [224];
  undefined8 auStack_118 [29];
  
  iVar7 = height / 2;
  iVar8 = iVar7 + -1;
  uVar4 = (long)(iVar7 + width + 0x1e) & 0xfffffffffffffff0;
  lVar14 = (long)(height + -2);
  ppVar5 = src + -lVar14;
  uVar12 = 0;
  ppVar13 = ppVar5;
  if (4 < iVar8) {
    uVar12 = 0;
    in_XMM0 = (undefined1  [16])0x0;
    in_XMM1 = pmovsxbw(in_XMM1,0x202020202020202);
    in_XMM2 = ZEXT816(0xf0d0b0907050301);
    do {
      auVar15 = *(undefined1 (*) [16])(src + uVar12 * 2 + (-1 - lVar14));
      auVar27 = *(undefined1 (*) [16])(src + (uVar12 * 2 - lVar14));
      auVar16 = *(undefined1 (*) [16])(src + uVar12 * 2 + (1 - lVar14));
      in_XMM8 = pmovzxbw(in_XMM8,auVar15);
      auVar18 = pmovzxbw(in_XMM4,auVar27);
      auVar45 = pmovzxbw(in_XMM9,auVar16);
      in_XMM9._0_2_ = auVar45._0_2_ + in_XMM8._0_2_;
      in_XMM9._2_2_ = auVar45._2_2_ + in_XMM8._2_2_;
      in_XMM9._4_2_ = auVar45._4_2_ + in_XMM8._4_2_;
      in_XMM9._6_2_ = auVar45._6_2_ + in_XMM8._6_2_;
      in_XMM9._8_2_ = auVar45._8_2_ + in_XMM8._8_2_;
      in_XMM9._10_2_ = auVar45._10_2_ + in_XMM8._10_2_;
      in_XMM9._12_2_ = auVar45._12_2_ + in_XMM8._12_2_;
      in_XMM9._14_2_ = auVar45._14_2_ + in_XMM8._14_2_;
      in_XMM7._0_2_ = (ushort)auVar16[8] + (ushort)auVar15[8];
      in_XMM7._2_2_ = (ushort)auVar16[9] + (ushort)auVar15[9];
      in_XMM7._4_2_ = (ushort)auVar16[10] + (ushort)auVar15[10];
      in_XMM7._6_2_ = (ushort)auVar16[0xb] + (ushort)auVar15[0xb];
      in_XMM7._8_2_ = (ushort)auVar16[0xc] + (ushort)auVar15[0xc];
      in_XMM7._10_2_ = (ushort)auVar16[0xd] + (ushort)auVar15[0xd];
      in_XMM7._12_2_ = (ushort)auVar16[0xe] + (ushort)auVar15[0xe];
      in_XMM7._14_2_ = (ushort)auVar16[0xf] + (ushort)auVar15[0xf];
      uVar17 = (ushort)(auVar18._0_2_ * 2 + in_XMM9._0_2_ + in_XMM1._0_2_) >> 2;
      uVar20 = (ushort)(auVar18._2_2_ * 2 + in_XMM9._2_2_ + in_XMM1._2_2_) >> 2;
      uVar21 = (ushort)(auVar18._4_2_ * 2 + in_XMM9._4_2_ + in_XMM1._4_2_) >> 2;
      uVar22 = (ushort)(auVar18._6_2_ * 2 + in_XMM9._6_2_ + in_XMM1._6_2_) >> 2;
      uVar23 = (ushort)(auVar18._8_2_ * 2 + in_XMM9._8_2_ + in_XMM1._8_2_) >> 2;
      uVar24 = (ushort)(auVar18._10_2_ * 2 + in_XMM9._10_2_ + in_XMM1._10_2_) >> 2;
      uVar25 = (ushort)(auVar18._12_2_ * 2 + in_XMM9._12_2_ + in_XMM1._12_2_) >> 2;
      uVar26 = (ushort)(auVar18._14_2_ * 2 + in_XMM9._14_2_ + in_XMM1._14_2_) >> 2;
      uVar28 = (ushort)((ushort)auVar27[8] * 2 + in_XMM7._0_2_ + in_XMM1._0_2_) >> 2;
      uVar30 = (ushort)((ushort)auVar27[9] * 2 + in_XMM7._2_2_ + in_XMM1._2_2_) >> 2;
      uVar32 = (ushort)((ushort)auVar27[10] * 2 + in_XMM7._4_2_ + in_XMM1._4_2_) >> 2;
      uVar34 = (ushort)((ushort)auVar27[0xb] * 2 + in_XMM7._6_2_ + in_XMM1._6_2_) >> 2;
      uVar36 = (ushort)((ushort)auVar27[0xc] * 2 + in_XMM7._8_2_ + in_XMM1._8_2_) >> 2;
      uVar38 = (ushort)((ushort)auVar27[0xd] * 2 + in_XMM7._10_2_ + in_XMM1._10_2_) >> 2;
      uVar40 = (ushort)((ushort)auVar27[0xe] * 2 + in_XMM7._12_2_ + in_XMM1._12_2_) >> 2;
      uVar42 = (ushort)((ushort)auVar27[0xf] * 2 + in_XMM7._14_2_ + in_XMM1._14_2_) >> 2;
      auVar15[1] = (uVar20 != 0) * (uVar20 < 0x100) * (char)uVar20 - (0xff < uVar20);
      auVar15[0] = (uVar17 != 0) * (uVar17 < 0x100) * (char)uVar17 - (0xff < uVar17);
      auVar15[2] = (uVar21 != 0) * (uVar21 < 0x100) * (char)uVar21 - (0xff < uVar21);
      auVar15[3] = (uVar22 != 0) * (uVar22 < 0x100) * (char)uVar22 - (0xff < uVar22);
      auVar15[4] = (uVar23 != 0) * (uVar23 < 0x100) * (char)uVar23 - (0xff < uVar23);
      auVar15[5] = (uVar24 != 0) * (uVar24 < 0x100) * (char)uVar24 - (0xff < uVar24);
      auVar15[6] = (uVar25 != 0) * (uVar25 < 0x100) * (char)uVar25 - (0xff < uVar25);
      auVar15[7] = (uVar26 != 0) * (uVar26 < 0x100) * (char)uVar26 - (0xff < uVar26);
      auVar15[8] = (uVar28 != 0) * (uVar28 < 0x100) * (char)uVar28 - (0xff < uVar28);
      auVar15[9] = (uVar30 != 0) * (uVar30 < 0x100) * (char)uVar30 - (0xff < uVar30);
      auVar15[10] = (uVar32 != 0) * (uVar32 < 0x100) * (char)uVar32 - (0xff < uVar32);
      auVar15[0xb] = (uVar34 != 0) * (uVar34 < 0x100) * (char)uVar34 - (0xff < uVar34);
      auVar15[0xc] = (uVar36 != 0) * (uVar36 < 0x100) * (char)uVar36 - (0xff < uVar36);
      auVar15[0xd] = (uVar38 != 0) * (uVar38 < 0x100) * (char)uVar38 - (0xff < uVar38);
      auVar15[0xe] = (uVar40 != 0) * (uVar40 < 0x100) * (char)uVar40 - (0xff < uVar40);
      auVar15[0xf] = (uVar42 != 0) * (uVar42 < 0x100) * (char)uVar42 - (0xff < uVar42);
      auVar27 = pshufb(auVar15,in_XMM2);
      in_XMM4 = pshufb(auVar15,ZEXT816(0xe0c0a0806040200));
      *(long *)((long)auStack_118 + uVar12 + uVar4) = in_XMM4._0_8_;
      *(long *)((long)auStack_118 + uVar12) = auVar27._0_8_;
      uVar12 = uVar12 + 8;
      ppVar13 = ppVar13 + 0x10;
    } while (uVar12 < iVar7 - 5);
  }
  if ((int)uVar12 < iVar8) {
    auVar15 = pmovzxbw(in_XMM0,*(undefined8 *)(ppVar13 + -1));
    auVar27 = pmovzxbw(in_XMM1,*(undefined8 *)ppVar13);
    auVar16 = pmovzxbw(in_XMM2,*(undefined8 *)(ppVar13 + 1));
    in_XMM2._0_2_ = auVar16._0_2_ + auVar15._0_2_;
    in_XMM2._2_2_ = auVar16._2_2_ + auVar15._2_2_;
    in_XMM2._4_2_ = auVar16._4_2_ + auVar15._4_2_;
    in_XMM2._6_2_ = auVar16._6_2_ + auVar15._6_2_;
    in_XMM2._8_2_ = auVar16._8_2_ + auVar15._8_2_;
    in_XMM2._10_2_ = auVar16._10_2_ + auVar15._10_2_;
    in_XMM2._12_2_ = auVar16._12_2_ + auVar15._12_2_;
    in_XMM2._14_2_ = auVar16._14_2_ + auVar15._14_2_;
    uVar17 = (ushort)(auVar27._0_2_ * 2 + in_XMM2._0_2_ + 2U) >> 2;
    uVar20 = (ushort)(auVar27._2_2_ * 2 + in_XMM2._2_2_ + 2U) >> 2;
    uVar21 = (ushort)(auVar27._4_2_ * 2 + in_XMM2._4_2_ + 2U) >> 2;
    uVar22 = (ushort)(auVar27._6_2_ * 2 + in_XMM2._6_2_ + 2U) >> 2;
    uVar23 = (ushort)(auVar27._8_2_ * 2 + in_XMM2._8_2_ + 2U) >> 2;
    uVar24 = (ushort)(auVar27._10_2_ * 2 + in_XMM2._10_2_ + 2U) >> 2;
    uVar25 = (ushort)(auVar27._12_2_ * 2 + in_XMM2._12_2_ + 2U) >> 2;
    uVar26 = (ushort)(auVar27._14_2_ * 2 + in_XMM2._14_2_ + 2U) >> 2;
    auVar27[1] = (uVar20 != 0) * (uVar20 < 0x100) * (char)uVar20 - (0xff < uVar20);
    auVar27[0] = (uVar17 != 0) * (uVar17 < 0x100) * (char)uVar17 - (0xff < uVar17);
    auVar27[2] = (uVar21 != 0) * (uVar21 < 0x100) * (char)uVar21 - (0xff < uVar21);
    auVar27[3] = (uVar22 != 0) * (uVar22 < 0x100) * (char)uVar22 - (0xff < uVar22);
    auVar27[4] = (uVar23 != 0) * (uVar23 < 0x100) * (char)uVar23 - (0xff < uVar23);
    auVar27[5] = (uVar24 != 0) * (uVar24 < 0x100) * (char)uVar24 - (0xff < uVar24);
    auVar27[6] = (uVar25 != 0) * (uVar25 < 0x100) * (char)uVar25 - (0xff < uVar25);
    auVar27[7] = (uVar26 != 0) * (uVar26 < 0x100) * (char)uVar26 - (0xff < uVar26);
    auVar27[8] = (uVar17 != 0) * (uVar17 < 0x100) * (char)uVar17 - (0xff < uVar17);
    auVar27[9] = (uVar20 != 0) * (uVar20 < 0x100) * (char)uVar20 - (0xff < uVar20);
    auVar27[10] = (uVar21 != 0) * (uVar21 < 0x100) * (char)uVar21 - (0xff < uVar21);
    auVar27[0xb] = (uVar22 != 0) * (uVar22 < 0x100) * (char)uVar22 - (0xff < uVar22);
    auVar27[0xc] = (uVar23 != 0) * (uVar23 < 0x100) * (char)uVar23 - (0xff < uVar23);
    auVar27[0xd] = (uVar24 != 0) * (uVar24 < 0x100) * (char)uVar24 - (0xff < uVar24);
    auVar27[0xe] = (uVar25 != 0) * (uVar25 < 0x100) * (char)uVar25 - (0xff < uVar25);
    auVar27[0xf] = (uVar26 != 0) * (uVar26 < 0x100) * (char)uVar26 - (0xff < uVar26);
    auVar15 = pshufb(auVar27,_DAT_001846a0);
    in_XMM1 = pshufb(auVar27,_DAT_001846b0);
    *(int *)((long)auStack_118 + (uVar12 & 0xffffffff) + uVar4) = in_XMM1._0_4_;
    *(int *)((long)auStack_118 + (uVar12 & 0xffffffff)) = auVar15._0_4_;
  }
  lVar14 = (long)iVar8;
  if (0 < width) {
    pauVar6 = (undefined1 (*) [16])(ppVar5 + lVar14 * 2);
    auVar15 = pmovsxbw(in_XMM1,0x404040404040404);
    auVar27 = pmovsxbw(in_XMM2,0x202020202020202);
    lVar10 = lVar14;
    do {
      auVar16 = *(undefined1 (*) [16])(pauVar6[-1] + 0xf);
      auVar18 = *pauVar6;
      auVar45 = *(undefined1 (*) [16])(*pauVar6 + 1);
      auVar2 = *(undefined1 (*) [16])(*pauVar6 + 2);
      auVar19 = pmovzxbw(in_XMM4,auVar16);
      in_XMM8 = pmovzxbw(in_XMM8,auVar18);
      auVar44 = pmovzxbw(in_XMM7,auVar45);
      auVar46 = pmovzxbw(in_XMM10,auVar2);
      in_XMM7._0_2_ = auVar44._0_2_ + in_XMM8._0_2_;
      in_XMM7._2_2_ = auVar44._2_2_ + in_XMM8._2_2_;
      in_XMM7._4_2_ = auVar44._4_2_ + in_XMM8._4_2_;
      in_XMM7._6_2_ = auVar44._6_2_ + in_XMM8._6_2_;
      in_XMM7._8_2_ = auVar44._8_2_ + in_XMM8._8_2_;
      in_XMM7._10_2_ = auVar44._10_2_ + in_XMM8._10_2_;
      in_XMM7._12_2_ = auVar44._12_2_ + in_XMM8._12_2_;
      in_XMM7._14_2_ = auVar44._14_2_ + in_XMM8._14_2_;
      sVar29 = (ushort)auVar45[8] + (ushort)auVar18[8];
      sVar31 = (ushort)auVar45[9] + (ushort)auVar18[9];
      sVar33 = (ushort)auVar45[10] + (ushort)auVar18[10];
      sVar35 = (ushort)auVar45[0xb] + (ushort)auVar18[0xb];
      sVar37 = (ushort)auVar45[0xc] + (ushort)auVar18[0xc];
      sVar39 = (ushort)auVar45[0xd] + (ushort)auVar18[0xd];
      sVar41 = (ushort)auVar45[0xe] + (ushort)auVar18[0xe];
      sVar43 = (ushort)auVar45[0xf] + (ushort)auVar18[0xf];
      uVar28 = (ushort)(auVar46._0_2_ + auVar19._0_2_ + auVar15._0_2_ + in_XMM7._0_2_ * 3) >> 3;
      uVar30 = (ushort)(auVar46._2_2_ + auVar19._2_2_ + auVar15._2_2_ + in_XMM7._2_2_ * 3) >> 3;
      uVar32 = (ushort)(auVar46._4_2_ + auVar19._4_2_ + auVar15._4_2_ + in_XMM7._4_2_ * 3) >> 3;
      uVar34 = (ushort)(auVar46._6_2_ + auVar19._6_2_ + auVar15._6_2_ + in_XMM7._6_2_ * 3) >> 3;
      uVar36 = (ushort)(auVar46._8_2_ + auVar19._8_2_ + auVar15._8_2_ + in_XMM7._8_2_ * 3) >> 3;
      uVar38 = (ushort)(auVar46._10_2_ + auVar19._10_2_ + auVar15._10_2_ + in_XMM7._10_2_ * 3) >> 3;
      uVar40 = (ushort)(auVar46._12_2_ + auVar19._12_2_ + auVar15._12_2_ + in_XMM7._12_2_ * 3) >> 3;
      uVar42 = (ushort)(auVar46._14_2_ + auVar19._14_2_ + auVar15._14_2_ + in_XMM7._14_2_ * 3) >> 3;
      uVar17 = (ushort)((ushort)auVar2[8] + (ushort)auVar16[8] + auVar15._0_2_ + sVar29 * 3) >> 3;
      uVar20 = (ushort)((ushort)auVar2[9] + (ushort)auVar16[9] + auVar15._2_2_ + sVar31 * 3) >> 3;
      uVar21 = (ushort)((ushort)auVar2[10] + (ushort)auVar16[10] + auVar15._4_2_ + sVar33 * 3) >> 3;
      uVar22 = (ushort)((ushort)auVar2[0xb] + (ushort)auVar16[0xb] + auVar15._6_2_ + sVar35 * 3) >>
               3;
      uVar23 = (ushort)((ushort)auVar2[0xc] + (ushort)auVar16[0xc] + auVar15._8_2_ + sVar37 * 3) >>
               3;
      uVar24 = (ushort)((ushort)auVar2[0xd] + (ushort)auVar16[0xd] + auVar15._10_2_ + sVar39 * 3) >>
               3;
      uVar25 = (ushort)((ushort)auVar2[0xe] + (ushort)auVar16[0xe] + auVar15._12_2_ + sVar41 * 3) >>
               3;
      uVar26 = (ushort)((ushort)auVar2[0xf] + (ushort)auVar16[0xf] + auVar15._14_2_ + sVar43 * 3) >>
               3;
      in_XMM10[1] = (uVar30 != 0) * (uVar30 < 0x100) * (char)uVar30 - (0xff < uVar30);
      in_XMM10[0] = (uVar28 != 0) * (uVar28 < 0x100) * (char)uVar28 - (0xff < uVar28);
      in_XMM10[2] = (uVar32 != 0) * (uVar32 < 0x100) * (char)uVar32 - (0xff < uVar32);
      in_XMM10[3] = (uVar34 != 0) * (uVar34 < 0x100) * (char)uVar34 - (0xff < uVar34);
      in_XMM10[4] = (uVar36 != 0) * (uVar36 < 0x100) * (char)uVar36 - (0xff < uVar36);
      in_XMM10[5] = (uVar38 != 0) * (uVar38 < 0x100) * (char)uVar38 - (0xff < uVar38);
      in_XMM10[6] = (uVar40 != 0) * (uVar40 < 0x100) * (char)uVar40 - (0xff < uVar40);
      in_XMM10[7] = (uVar42 != 0) * (uVar42 < 0x100) * (char)uVar42 - (0xff < uVar42);
      in_XMM10[8] = (uVar17 != 0) * (uVar17 < 0x100) * (char)uVar17 - (0xff < uVar17);
      in_XMM10[9] = (uVar20 != 0) * (uVar20 < 0x100) * (char)uVar20 - (0xff < uVar20);
      in_XMM10[10] = (uVar21 != 0) * (uVar21 < 0x100) * (char)uVar21 - (0xff < uVar21);
      in_XMM10[0xb] = (uVar22 != 0) * (uVar22 < 0x100) * (char)uVar22 - (0xff < uVar22);
      in_XMM10[0xc] = (uVar23 != 0) * (uVar23 < 0x100) * (char)uVar23 - (0xff < uVar23);
      in_XMM10[0xd] = (uVar24 != 0) * (uVar24 < 0x100) * (char)uVar24 - (0xff < uVar24);
      in_XMM10[0xe] = (uVar25 != 0) * (uVar25 < 0x100) * (char)uVar25 - (0xff < uVar25);
      in_XMM10[0xf] = (uVar26 != 0) * (uVar26 < 0x100) * (char)uVar26 - (0xff < uVar26);
      *(undefined1 (*) [16])((long)auStack_118 + lVar10) = in_XMM10;
      uVar28 = (ushort)(auVar19._0_2_ + in_XMM8._0_2_ + in_XMM7._0_2_ + auVar27._0_2_) >> 2;
      uVar30 = (ushort)(auVar19._2_2_ + in_XMM8._2_2_ + in_XMM7._2_2_ + auVar27._2_2_) >> 2;
      uVar32 = (ushort)(auVar19._4_2_ + in_XMM8._4_2_ + in_XMM7._4_2_ + auVar27._4_2_) >> 2;
      uVar34 = (ushort)(auVar19._6_2_ + in_XMM8._6_2_ + in_XMM7._6_2_ + auVar27._6_2_) >> 2;
      uVar36 = (ushort)(auVar19._8_2_ + in_XMM8._8_2_ + in_XMM7._8_2_ + auVar27._8_2_) >> 2;
      uVar38 = (ushort)(auVar19._10_2_ + in_XMM8._10_2_ + in_XMM7._10_2_ + auVar27._10_2_) >> 2;
      uVar40 = (ushort)(auVar19._12_2_ + in_XMM8._12_2_ + in_XMM7._12_2_ + auVar27._12_2_) >> 2;
      uVar42 = (ushort)(auVar19._14_2_ + in_XMM8._14_2_ + in_XMM7._14_2_ + auVar27._14_2_) >> 2;
      uVar17 = (ushort)((ushort)auVar18[8] + (ushort)auVar16[8] + sVar29 + auVar27._0_2_) >> 2;
      uVar20 = (ushort)((ushort)auVar18[9] + (ushort)auVar16[9] + sVar31 + auVar27._2_2_) >> 2;
      uVar21 = (ushort)((ushort)auVar18[10] + (ushort)auVar16[10] + sVar33 + auVar27._4_2_) >> 2;
      uVar22 = (ushort)((ushort)auVar18[0xb] + (ushort)auVar16[0xb] + sVar35 + auVar27._6_2_) >> 2;
      uVar23 = (ushort)((ushort)auVar18[0xc] + (ushort)auVar16[0xc] + sVar37 + auVar27._8_2_) >> 2;
      uVar24 = (ushort)((ushort)auVar18[0xd] + (ushort)auVar16[0xd] + sVar39 + auVar27._10_2_) >> 2;
      uVar25 = (ushort)((ushort)auVar18[0xe] + (ushort)auVar16[0xe] + sVar41 + auVar27._12_2_) >> 2;
      uVar26 = (ushort)((ushort)auVar18[0xf] + (ushort)auVar16[0xf] + sVar43 + auVar27._14_2_) >> 2;
      in_XMM4[1] = (uVar30 != 0) * (uVar30 < 0x100) * (char)uVar30 - (0xff < uVar30);
      in_XMM4[0] = (uVar28 != 0) * (uVar28 < 0x100) * (char)uVar28 - (0xff < uVar28);
      in_XMM4[2] = (uVar32 != 0) * (uVar32 < 0x100) * (char)uVar32 - (0xff < uVar32);
      in_XMM4[3] = (uVar34 != 0) * (uVar34 < 0x100) * (char)uVar34 - (0xff < uVar34);
      in_XMM4[4] = (uVar36 != 0) * (uVar36 < 0x100) * (char)uVar36 - (0xff < uVar36);
      in_XMM4[5] = (uVar38 != 0) * (uVar38 < 0x100) * (char)uVar38 - (0xff < uVar38);
      in_XMM4[6] = (uVar40 != 0) * (uVar40 < 0x100) * (char)uVar40 - (0xff < uVar40);
      in_XMM4[7] = (uVar42 != 0) * (uVar42 < 0x100) * (char)uVar42 - (0xff < uVar42);
      in_XMM4[8] = (uVar17 != 0) * (uVar17 < 0x100) * (char)uVar17 - (0xff < uVar17);
      in_XMM4[9] = (uVar20 != 0) * (uVar20 < 0x100) * (char)uVar20 - (0xff < uVar20);
      in_XMM4[10] = (uVar21 != 0) * (uVar21 < 0x100) * (char)uVar21 - (0xff < uVar21);
      in_XMM4[0xb] = (uVar22 != 0) * (uVar22 < 0x100) * (char)uVar22 - (0xff < uVar22);
      in_XMM4[0xc] = (uVar23 != 0) * (uVar23 < 0x100) * (char)uVar23 - (0xff < uVar23);
      in_XMM4[0xd] = (uVar24 != 0) * (uVar24 < 0x100) * (char)uVar24 - (0xff < uVar24);
      in_XMM4[0xe] = (uVar25 != 0) * (uVar25 < 0x100) * (char)uVar25 - (0xff < uVar25);
      in_XMM4[0xf] = (uVar26 != 0) * (uVar26 < 0x100) * (char)uVar26 - (0xff < uVar26);
      *(undefined1 (*) [16])((long)auStack_118 + lVar10 + uVar4) = in_XMM4;
      lVar10 = lVar10 + 0x10;
      pauVar6 = pauVar6 + 1;
    } while (lVar10 < iVar7 + width + -1);
  }
  lVar10 = lVar14 + uVar4 + -0x118;
  uVar11 = height >> 1;
  if (width == 4) {
    if (0 < (int)uVar11) {
      lVar9 = 0;
      do {
        *(undefined4 *)dst = *(undefined4 *)((long)auStack_118 + lVar9 + lVar14);
        *(undefined4 *)(dst + i_dst) = *(undefined4 *)((long)auStack_118 + lVar9 + lVar10 + 0x118);
        dst = dst + i_dst * 2;
        lVar9 = lVar9 + -1;
      } while (-lVar9 != (ulong)uVar11);
    }
  }
  else if (width == 8) {
    if (0 < (int)uVar11) {
      lVar9 = 0;
      do {
        *(undefined8 *)dst = *(undefined8 *)((long)auStack_118 + lVar9 + lVar14);
        *(undefined8 *)(dst + i_dst) = *(undefined8 *)((long)auStack_118 + lVar9 + lVar10 + 0x118);
        dst = dst + i_dst * 2;
        lVar9 = lVar9 + -1;
      } while (-lVar9 != (ulong)uVar11);
    }
  }
  else if (width == 0x10) {
    if (0 < (int)uVar11) {
      lVar9 = 0;
      do {
        puVar1 = (undefined8 *)((long)auStack_118 + lVar9 + lVar14);
        uVar3 = puVar1[1];
        *(undefined8 *)dst = *puVar1;
        *(undefined8 *)(dst + 8) = uVar3;
        puVar1 = (undefined8 *)((long)auStack_118 + lVar9 + lVar10 + 0x118);
        uVar3 = puVar1[1];
        *(undefined8 *)(dst + i_dst) = *puVar1;
        *(undefined8 *)(dst + i_dst + 8) = uVar3;
        dst = dst + i_dst * 2;
        lVar9 = lVar9 + -1;
      } while (-lVar9 != (ulong)uVar11);
    }
  }
  else if (0 < (int)uVar11) {
    lVar9 = 0;
    do {
      memcpy(dst,(void *)((long)auStack_118 + lVar9 + lVar14),(long)width);
      memcpy(dst + i_dst,(void *)((long)auStack_118 + lVar9 + lVar10 + 0x118),(long)width);
      dst = dst + i_dst * 2;
      lVar9 = lVar9 + -1;
    } while (-lVar9 != (ulong)uVar11);
  }
  return;
}

Assistant:

void uavs3d_ipred_ang_xy_16_sse(pel *src, pel *dst, int i_dst, int mode, int width, int height)
{
	ALIGNED_16(pel first_line[2 * (64 + 48)]);
	int line_size = width + height / 2 - 1;
	int left_size = line_size - width;
	int aligned_line_size = ((line_size + 31) >> 4) << 4;
    pel *pfirst[2];
	__m128i zero = _mm_setzero_si128();
	__m128i coeff2 = _mm_set1_epi16(2);
	__m128i coeff3 = _mm_set1_epi16(3);
	__m128i coeff4 = _mm_set1_epi16(4);
	__m128i shuffle1 = _mm_setr_epi8(0, 2, 4, 6, 8, 10, 12, 14, 1, 3, 5, 7, 9, 11, 13, 15);
	__m128i shuffle2 = _mm_setr_epi8(1, 3, 5, 7, 9, 11, 13, 15, 0, 2, 4, 6, 8, 10, 12, 14);
	int i;
    pel *src1;

    pfirst[0] = first_line;
    pfirst[1] = first_line + aligned_line_size;

	src -= height - 2;

	src1 = src;

	for (i = 0; i < left_size - 4; i += 8, src += 16)
	{
		__m128i p00, p01, p10, p11;
		__m128i S0 = _mm_loadu_si128((__m128i*)(src - 1));
		__m128i S2 = _mm_loadu_si128((__m128i*)(src + 1));
		__m128i S1 = _mm_loadu_si128((__m128i*)(src));

		__m128i L0 = _mm_unpacklo_epi8(S0, zero);
		__m128i L1 = _mm_unpacklo_epi8(S1, zero);
		__m128i L2 = _mm_unpacklo_epi8(S2, zero);

		__m128i H0 = _mm_unpackhi_epi8(S0, zero);
		__m128i H1 = _mm_unpackhi_epi8(S1, zero);
		__m128i H2 = _mm_unpackhi_epi8(S2, zero);

		p00 = _mm_add_epi16(L0, L1);
		p01 = _mm_add_epi16(L1, L2);
		p10 = _mm_add_epi16(H0, H1);
		p11 = _mm_add_epi16(H1, H2);

		p00 = _mm_add_epi16(p00, coeff2);
		p10 = _mm_add_epi16(p10, coeff2);

		p00 = _mm_add_epi16(p00, p01);
		p10 = _mm_add_epi16(p10, p11);

		p00 = _mm_srli_epi16(p00, 2);
		p10 = _mm_srli_epi16(p10, 2);
		p00 = _mm_packus_epi16(p00, p10);

		p10 = _mm_shuffle_epi8(p00, shuffle2);
		p00 = _mm_shuffle_epi8(p00, shuffle1);
		_mm_storel_epi64((__m128i*)&pfirst[1][i], p00);
		_mm_storel_epi64((__m128i*)&pfirst[0][i], p10);
	}

	if (i < left_size)
	{
		__m128i p00, p01;
		__m128i S0 = _mm_loadu_si128((__m128i*)(src - 1));
		__m128i S2 = _mm_loadu_si128((__m128i*)(src + 1));
		__m128i S1 = _mm_loadu_si128((__m128i*)(src));

		__m128i L0 = _mm_unpacklo_epi8(S0, zero);
		__m128i L1 = _mm_unpacklo_epi8(S1, zero);
		__m128i L2 = _mm_unpacklo_epi8(S2, zero);

		p00 = _mm_add_epi16(L0, L1);
		p01 = _mm_add_epi16(L1, L2);
		p00 = _mm_add_epi16(p00, coeff2);
		p00 = _mm_add_epi16(p00, p01);
		p00 = _mm_srli_epi16(p00, 2);
		p00 = _mm_packus_epi16(p00, p00);

		p01 = _mm_shuffle_epi8(p00, shuffle2);
		p00 = _mm_shuffle_epi8(p00, shuffle1);
		((int*)&pfirst[1][i])[0] = _mm_cvtsi128_si32(p00);
		((int*)&pfirst[0][i])[0] = _mm_cvtsi128_si32(p01);
	}

	src = src1 + left_size + left_size;

	for (i = left_size; i < line_size; i += 16, src += 16)
	{
		__m128i p00, p01, p10, p11;
		__m128i S0 = _mm_loadu_si128((__m128i*)(src - 1));
		__m128i S3 = _mm_loadu_si128((__m128i*)(src + 2));
		__m128i S1 = _mm_loadu_si128((__m128i*)(src));
		__m128i S2 = _mm_loadu_si128((__m128i*)(src + 1));

		__m128i L0 = _mm_unpacklo_epi8(S0, zero);
		__m128i L1 = _mm_unpacklo_epi8(S1, zero);
		__m128i L2 = _mm_unpacklo_epi8(S2, zero);
		__m128i L3 = _mm_unpacklo_epi8(S3, zero);

		__m128i H0 = _mm_unpackhi_epi8(S0, zero);
		__m128i H1 = _mm_unpackhi_epi8(S1, zero);
		__m128i H2 = _mm_unpackhi_epi8(S2, zero);
		__m128i H3 = _mm_unpackhi_epi8(S3, zero);

		p00 = _mm_add_epi16(L1, L2);
		p10 = _mm_add_epi16(H1, H2);
		p00 = _mm_mullo_epi16(p00, coeff3);
		p10 = _mm_mullo_epi16(p10, coeff3);

		p01 = _mm_add_epi16(L0, L3);
		p11 = _mm_add_epi16(H0, H3);
		p00 = _mm_add_epi16(p00, coeff4);
		p10 = _mm_add_epi16(p10, coeff4);
		p00 = _mm_add_epi16(p00, p01);
		p10 = _mm_add_epi16(p10, p11);

		p00 = _mm_srli_epi16(p00, 3);
		p10 = _mm_srli_epi16(p10, 3);

		p00 = _mm_packus_epi16(p00, p10);
		_mm_storeu_si128((__m128i*)&pfirst[0][i], p00);

		p00 = _mm_add_epi16(L0, L1);
		p01 = _mm_add_epi16(L1, L2);
		p10 = _mm_add_epi16(H0, H1);
		p11 = _mm_add_epi16(H1, H2);

		p00 = _mm_add_epi16(p00, coeff2);
		p10 = _mm_add_epi16(p10, coeff2);

		p00 = _mm_add_epi16(p00, p01);
		p10 = _mm_add_epi16(p10, p11);

		p00 = _mm_srli_epi16(p00, 2);
		p10 = _mm_srli_epi16(p10, 2);

		p00 = _mm_packus_epi16(p00, p10);
		_mm_storeu_si128((__m128i*)&pfirst[1][i], p00);
	}

	pfirst[0] += left_size;
	pfirst[1] += left_size;

	height >>= 1;

    switch (width) {
    case 4:
        for (i = 0; i < height; i++) {
            CP32(dst,         pfirst[0] - i);
            CP32(dst + i_dst, pfirst[1] - i);
            dst += (i_dst << 1);
        }
        break;
    case 8:
        for (i = 0; i < height; i++) {
            CP64(dst,         pfirst[0] - i);
            CP64(dst + i_dst, pfirst[1] - i);
            dst += (i_dst << 1);
        }
        break;
    case 16:
        for (i = 0; i < height; i++) {
            CP128(dst,         pfirst[0] - i);
            CP128(dst + i_dst, pfirst[1] - i);
            dst += (i_dst << 1);
        }
        break;
    default:
        for (i = 0; i < height; i++) {
            memcpy(dst,         pfirst[0] - i, width * sizeof(pel));
            memcpy(dst + i_dst, pfirst[1] - i, width * sizeof(pel));
            dst += (i_dst << 1);
        }
        break;
    }
	
}